

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O2

void __thiscall
ThreeWiseHash<unsigned_long_long,_unsigned_char>::__updateHashValue
          (ThreeWiseHash<unsigned_long_long,_unsigned_char> *this)

{
  pointer pCVar1;
  size_type sVar2;
  byte *pbVar3;
  size_t k;
  ulong __n;
  long lVar4;
  
  this->hashvalue = 0;
  lVar4 = 0;
  __n = 0;
  while( true ) {
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->ngram);
    if (sVar2 <= __n) break;
    pCVar1 = (this->hashers).
             super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (&(this->ngram).
                         super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Deque_impl_data._M_start,__n);
    this->hashvalue =
         this->hashvalue ^ *(ulong *)((long)pCVar1->hashvalues + lVar4 + (ulong)*pbVar3 * 8);
    __n = __n + 1;
    lVar4 = lVar4 + 0x800;
  }
  return;
}

Assistant:

void __updateHashValue() {
    hashvalue = 0;
    for (size_t k = 0; k < ngram.size(); ++k) {
      hashvalue ^= hashers[k].hashvalues[ngram[k]];
    }
  }